

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitMatrixCursor.h
# Opt level: O2

int __thiscall
ZXing::BitMatrixCursor<ZXing::PointT<double>_>::stepToEdge
          (BitMatrixCursor<ZXing::PointT<double>_> *this,int nth,int range,bool backup)

{
  int iVar1;
  double dVar2;
  Value VVar3;
  Value VVar4;
  int iVar5;
  double dVar6;
  PointT<double> p;
  
  VVar3 = testAt<double>(this,this->p);
  iVar5 = 0;
  while (((nth != 0 && (range == 0 || iVar5 < range)) && (VVar3.v != -1))) {
    iVar5 = iVar5 + 1;
    p.x = (this->d).x * (double)iVar5 + (this->p).x;
    p.y = (double)iVar5 * (this->d).y + (this->p).y;
    VVar4 = testAt<double>(this,p);
    nth = nth - (uint)(VVar3.v != VVar4.v);
    VVar3 = VVar4;
  }
  dVar6 = (double)(int)(iVar5 - (uint)backup);
  dVar2 = (this->d).y;
  (this->p).x = dVar6 * (this->d).x + (this->p).x;
  (this->p).y = dVar6 * dVar2 + (this->p).y;
  iVar1 = 0;
  if (nth == 0) {
    iVar1 = iVar5 - (uint)backup;
  }
  return iVar1;
}

Assistant:

int stepToEdge(int nth = 1, int range = 0, bool backup = false)
	{
		int steps = 0;
		auto lv = testAt(p);

		while (nth && (!range || steps < range) && lv.isValid()) {
			++steps;
			auto v = testAt(p + steps * d);
			if (lv != v) {
				lv = v;
				--nth;
			}
		}
		if (backup)
			--steps;
		p += steps * d;
		return steps * (nth == 0);
	}